

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

int FindMinBits_TargetCollisionShare(int nbHashes,double share)

{
  ulong uVar1;
  double dVar2;
  ulong unaff_RBX;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar6._0_8_ = (double)nbHashes;
  uVar3 = 2;
  while( true ) {
    dVar2 = (double)((uVar3 << 0x34) + 0x3f847ae147ae147b);
    dVar4 = ldexp(1.0,(int)uVar3);
    auVar5._0_8_ = (auVar6._0_8_ * (double)(nbHashes + -1)) / dVar4;
    auVar5._8_8_ = 0;
    auVar6._8_8_ = 0;
    auVar5 = vminsd_avx(auVar6,auVar5);
    uVar1 = unaff_RBX;
    if (auVar5._0_8_ < dVar2) {
      uVar1 = uVar3;
    }
    unaff_RBX = uVar1 & 0xffffffff;
    if (auVar5._0_8_ < dVar2) break;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x40) {
      return 0x40;
    }
  }
  return (int)uVar1;
}

Assistant:

static int FindMinBits_TargetCollisionShare(int nbHashes, double share)
{
    int nb;
    for (nb=2; nb<64; nb++) {
        double const maxColls = (double)(1ULL << nb) * share;
        double const nbColls = EstimateNbCollisions(nbHashes, nb);
        if (nbColls < maxColls) return nb;
    }
    assert(0);
    return nb;
}